

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cqm.cpp
# Opt level: O0

bool ReadCQM(MemFile *file,shared_ptr<Disk> *disk)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  ulong extraout_RAX;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  exception *peVar6;
  size_type sVar7;
  char *pcVar8;
  element_type *peVar9;
  mapped_type *pmVar10;
  uchar *puVar11;
  uchar *puVar12;
  iterator __first;
  iterator __last;
  size_t in_RCX;
  FILE *__stream;
  uint local_408;
  int local_404;
  allocator<char> local_3f1;
  key_type local_3f0;
  string local_3d0;
  uint16_t local_3ae;
  ushort local_3ac;
  allocator<char> local_3a9;
  undefined1 local_3a8 [2];
  uint16_t dos_time;
  uint16_t dos_date;
  allocator<char> local_381;
  key_type local_380;
  allocator<char> local_359;
  key_type local_358;
  string local_338;
  allocator<char> local_311;
  key_type local_310;
  allocator local_2e9;
  string local_2e8;
  undefined1 local_2c8 [8];
  string label;
  key_type local_2a0;
  allocator local_279;
  string local_278;
  undefined1 local_258 [8];
  string desc;
  uint32_t calc_data_crc;
  uint32_t data_crc;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_218;
  const_iterator local_210;
  allocator<unsigned_char> local_201;
  undefined1 local_200 [8];
  Data block;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  const_iterator local_1d8;
  value_type local_1c9;
  unsigned_short local_1c8;
  unsigned_short local_1c6;
  int iStack_1c4;
  uint8_t fill;
  int16_t len;
  uint16_t ulen;
  int data_size;
  Data data;
  key_type local_1a0;
  allocator local_179;
  string local_178;
  string local_158;
  allocator_type local_131;
  undefined1 local_130 [8];
  vector<char,_std::allocator<char>_> comment;
  undefined1 local_110 [4];
  int comment_len;
  Format fmt;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  uchar *local_c0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  uint local_ac;
  undefined1 local_a5;
  int header_checksum;
  CQM_HEADER dh;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  __stream = (FILE *)0x0;
  dh._125_8_ = disk;
  memset(&local_a5,0,0x85);
  MemFile::rewind(file,__stream);
  if (((extraout_RAX & 1) == 0) ||
     (uVar4 = MemFile::read(file,(int)&local_a5,(void *)0x85,in_RCX), (uVar4 & 1) == 0)) {
    return false;
  }
  iVar3 = memcmp(&local_a5,"CQ\x14",3);
  if (iVar3 != 0) {
    return false;
  }
  pvVar5 = &MemFile::data(file)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  local_b8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar5);
  pvVar5 = &MemFile::data(file)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  local_c8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvVar5);
  local_c0 = (uchar *)__gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_c8,0x85);
  local_ac = std::
             accumulate<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
                       (local_b8,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )local_c0,0);
  if ((local_ac & 0xff) != 0) {
    peVar6 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[20]>(peVar6,(char (*) [20])"bad header checksum");
    __cxa_throw(peVar6,&util::exception::typeinfo,util::exception::~exception);
  }
  Format::Format((Format *)local_110);
  fmt.cyls = 1;
  fmt.fdc = PC;
  if (dh.description[0x35] == '\x02') {
    local_404 = 1000000;
  }
  else {
    local_404 = 250000;
    if (dh.description[0x35] == '\x01') {
      local_404 = 500000;
    }
  }
  fmt.heads = local_404;
  if (dh.dos_time[1] < 2) {
    local_408 = 1;
  }
  else {
    local_408 = (uint)dh.dos_time[1];
  }
  fmt.base = local_408;
  fmt.offset = (int)dh.dos_date[0];
  fmt.sectors = (int)(byte)(dh.vol_label[9] + 1);
  fmt.head1._0_1_ = 0;
  if (dh.description[0x34] == '\0') {
    fmt.head1._0_1_ = 0xe5;
  }
  local_110 = (undefined1  [4])(uint)(byte)dh.description[0x37];
  uVar2 = util::le_value<2,_nullptr>((uint8_t (*) [2])(dh.dir_entries + 1));
  comment_len = (int)uVar2;
  uVar2 = util::le_value<2,_nullptr>((uint8_t (*) [2])&dh.num_fats);
  fmt.datarate = (DataRate)uVar2;
  uVar2 = util::le_value<2,_nullptr>((uint8_t (*) [2])((long)&header_checksum + 2));
  fmt.encoding = SizeToCode((uint)uVar2);
  Format::Validate((Format *)local_110);
  uVar2 = util::le_value<2,_nullptr>((uint8_t (*) [2])(dh.vol_label + 7));
  comment.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = ZEXT24(uVar2);
  if (comment.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 0) {
    sVar7 = (size_type)(int)comment.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_130,sVar7,&local_131);
    std::allocator<char>::~allocator(&local_131);
    bVar1 = MemFile::read<std::vector<char,std::allocator<char>>>
                      (file,(vector<char,_std::allocator<char>_> *)local_130);
    if (!bVar1) {
      peVar6 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[27]>
                (peVar6,(char (*) [27])"short file reading comment");
      __cxa_throw(peVar6,&util::exception::typeinfo,util::exception::~exception);
    }
    pcVar8 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_130);
    sVar7 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_130);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_178,pcVar8,sVar7,&local_179);
    util::trim(&local_158,&local_178);
    peVar9 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        dh._125_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"comment",
               (allocator<char> *)
               ((long)&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&peVar9->metadata,&local_1a0);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_130);
  }
  puVar11 = std::begin<unsigned_char,2ul>((uchar (*) [2])(dh.vol_label + 10));
  puVar12 = std::end<unsigned_char,2ul>((uchar (*) [2])(dh.vol_label + 10));
  iVar3 = std::accumulate<unsigned_char*,int>(puVar11,puVar12,0);
  if (iVar3 == 0) {
    puVar11 = std::begin<unsigned_char,13ul>((uchar (*) [13])dh.comment_len);
    puVar12 = std::end<unsigned_char,13ul>((uchar (*) [13])dh.comment_len);
    iVar3 = std::accumulate<unsigned_char*,int>(puVar11,puVar12,0);
    if (iVar3 == 0) goto LAB_0025eab8;
  }
  Message<>(msgWarning,"unused header fields contain non-zero values");
LAB_0025eab8:
  Data::Data((Data *)&len);
  iVar3 = Format::disk_size((Format *)local_110);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len,(long)iVar3);
  iVar3 = Format::track_size((Format *)local_110);
  __last._M_current = (uchar *)(ulong)(byte)dh.description[0x36];
  iStack_1c4 = iVar3 * (uint)(byte)dh.description[0x36] * comment_len;
  while (iVar3 = Data::size((Data *)&len), iVar3 < iStack_1c4) {
    uVar4 = MemFile::read(file,(int)&local_1c6,(void *)0x2,(size_t)__last._M_current);
    if ((uVar4 & 1) == 0) {
      peVar6 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[29]>
                (peVar6,(char (*) [29])"short file reading disk data");
      __cxa_throw(peVar6,&util::exception::typeinfo,util::exception::~exception);
    }
    local_1c8 = util::letoh<unsigned_short>(local_1c6);
    if ((short)local_1c8 < 1) {
      local_1c9 = '\0';
      MemFile::read(file,(int)&local_1c9,(void *)0x1,(size_t)__last._M_current);
      local_1e0._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_1d8,&local_1e0);
      __last._M_current = &local_1c9;
      block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len,
                               local_1d8,(long)-(int)(short)local_1c8,__last._M_current);
    }
    else {
      sVar7 = (size_type)(short)local_1c8;
      std::allocator<unsigned_char>::allocator(&local_201);
      Data::vector((Data *)local_200,sVar7,&local_201);
      std::allocator<unsigned_char>::~allocator(&local_201);
      MemFile::read<Data>(file,(Data *)local_200);
      local_218._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_210,&local_218);
      __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
      __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&len,local_210,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )__last._M_current);
      Data::~Data((Data *)local_200);
    }
  }
  desc.field_2._12_4_ = util::le_value<4,_nullptr>((uint8_t (*) [4])(dh.description + 0x38));
  puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len);
  iVar3 = Data::size((Data *)&len);
  desc.field_2._8_4_ = crc32(puVar11,iVar3,0);
  if (desc.field_2._8_4_ == desc.field_2._12_4_) {
    bVar1 = MemFile::eof(file);
    if (!bVar1) {
      Message<>(msgWarning,"extra data found at end of file");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,(char *)dh.hidden_sectors,0x3c,&local_279);
    util::trim((string *)local_258,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      peVar9 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          dh._125_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a0,"description",
                 (allocator<char> *)(label.field_2._M_local_buf + 0xf));
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar9->metadata,&local_2a0);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)local_258);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)(label.field_2._M_local_buf + 0xf));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2e8,(char *)&dh.read_mode,0xb,&local_2e9);
    util::trim((string *)local_2c8,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2c8,"** NONE **"), bVar1)) {
      peVar9 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          dh._125_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"label",&local_311);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar9->metadata,&local_310);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)local_2c8);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator(&local_311);
    }
    if (dh.description[0x37] != dh.description[0x36]) {
      std::__cxx11::to_string(&local_338,(uint)(byte)dh.description[0x36]);
      peVar9 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          dh._125_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"used_cyls",&local_359);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar9->metadata,&local_358);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator(&local_359);
      std::__cxx11::string::~string((string *)&local_338);
    }
    if ((byte)dh.description[0x34] < 3) {
      pcVar8 = ReadCQM::read_modes[(byte)dh.description[0x34]];
      peVar9 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          dh._125_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_380,"read_mode",&local_381);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar9->metadata,&local_380);
      std::__cxx11::string::operator=((string *)pmVar10,pcVar8);
      std::__cxx11::string::~string((string *)&local_380);
      std::allocator<char>::~allocator(&local_381);
    }
    if ((dh.dos_date[1] != '\0') && (dh.dos_date[1] < 7)) {
      pcVar8 = *(char **)(&DAT_00305418 + (ulong)dh.dos_date[1] * 8);
      peVar9 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          dh._125_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_3a8,"drive",&local_3a9);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar9->metadata,(key_type *)local_3a8);
      std::__cxx11::string::operator=((string *)pmVar10,pcVar8);
      std::__cxx11::string::~string((string *)local_3a8);
      std::allocator<char>::~allocator(&local_3a9);
    }
    local_3ac = util::le_value<2,_nullptr>((uint8_t (*) [2])(dh.vol_label + 5));
    local_3ae = util::le_value<2,_nullptr>((uint8_t (*) [2])(dh.vol_label + 3));
    FormatTime_abi_cxx11_(&local_3d0,(uint)local_3ac,(uint)local_3ae);
    peVar9 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        dh._125_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"created",&local_3f1);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&peVar9->metadata,&local_3f0);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    std::__cxx11::string::~string((string *)&local_3d0);
    iVar3 = Format::disk_size((Format *)local_110);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&len,(long)iVar3,
               (value_type *)&fmt.head1);
    peVar9 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        dh._125_8_);
    Disk::format(peVar9,(Format *)local_110,(Data *)&len,false);
    peVar9 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        dh._125_8_);
    std::__cxx11::string::operator=((string *)&peVar9->strType,"CQM");
    std::__cxx11::string::~string((string *)local_2c8);
    std::__cxx11::string::~string((string *)local_258);
    Data::~Data((Data *)&len);
    return true;
  }
  peVar6 = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[17]>(peVar6,(char (*) [17])"invalid data crc");
  __cxa_throw(peVar6,&util::exception::typeinfo,util::exception::~exception);
}

Assistant:

bool ReadCQM(MemFile& file, std::shared_ptr<Disk>& disk)
{
    CQM_HEADER dh{};
    if (!file.rewind() || !file.read(&dh, sizeof(dh)))
        return false;

    if (memcmp(&dh.sig, CQM_SIGNATURE, sizeof(dh.sig)))
        return false;

    auto header_checksum = std::accumulate(
        file.data().begin(), file.data().begin() + sizeof(dh), 0);
    if (header_checksum & 0xff)
        throw util::exception("bad header checksum");

    Format fmt;
    fmt.fdc = FdcType::PC;
    fmt.encoding = Encoding::MFM;
    fmt.datarate = (dh.density == 2) ? DataRate::_1M :
        (dh.density == 1) ? DataRate::_500K : DataRate::_250K;
    fmt.interleave = (dh.interleave <= 1) ? 1 : dh.interleave;
    fmt.skew = dh.skew;
    fmt.base = (dh.sector_base + 1) & 0xff;
    fmt.fill = (dh.read_mode == 0) ? 0xe5 : 0x00;
    fmt.cyls = dh.cyls;
    fmt.heads = util::le_value(dh.heads);
    fmt.sectors = util::le_value(dh.sec_per_track);
    fmt.size = SizeToCode(util::le_value(dh.sector_size));
    fmt.Validate();

    int comment_len = util::le_value(dh.comment_len);
    if (comment_len)
    {
        std::vector<char> comment(comment_len);
        if (!file.read(comment))
            throw util::exception("short file reading comment");
        disk->metadata["comment"] = util::trim(std::string(comment.data(), comment.size()));
    }

    if (std::accumulate(std::begin(dh.unknown), std::end(dh.unknown), 0) ||
        std::accumulate(std::begin(dh.unknown2), std::end(dh.unknown2), 0))
    {
        Message(msgWarning, "unused header fields contain non-zero values");
    }

    Data data;
    data.reserve(fmt.disk_size());

    auto data_size = fmt.track_size() * dh.used_cyls * fmt.heads;
    while (data.size() < data_size)
    {
        uint16_t ulen;
        if (!file.read(&ulen, sizeof(ulen)))
            throw util::exception("short file reading disk data");

        auto len = static_cast<int16_t>(util::letoh(ulen));
        if (len <= 0)
        {
            uint8_t fill = 0;
            file.read(&fill, sizeof(fill));
            data.insert(data.end(), -len, fill);
        }
        else
        {
            Data block(len);
            file.read(block);
            data.insert(data.end(), block.begin(), block.end());
        }
    }

    auto data_crc = util::le_value(dh.data_crc);
    auto calc_data_crc = crc32(data.data(), data.size());
    if (calc_data_crc != data_crc)
        throw util::exception("invalid data crc");

    if (!file.eof())
        Message(msgWarning, "extra data found at end of file");

    auto desc = util::trim(std::string(dh.description, sizeof(dh.description)));
    if (!desc.empty())
        disk->metadata["description"] = desc;

    auto label = util::trim(std::string(dh.vol_label, sizeof(dh.vol_label)));
    if (!label.empty() && label != "** NONE **")
        disk->metadata["label"] = label;

    if (dh.cyls != dh.used_cyls)
        disk->metadata["used_cyls"] = std::to_string(dh.used_cyls);

    static const char* read_modes[] = { "DOS", "blind", "HFS" };
    if (dh.read_mode < 3)
        disk->metadata["read_mode"] = read_modes[dh.read_mode];

    static const char* drv_types[] = {
        "5.25\" 360KB", "5.25\" 1.2MB", "3.5\" 720KB", "3.5\" 1.44MB", "8\"", "3.5\" 2.88MB" };
    if (dh.drv_type >= 1 && dh.drv_type <= 6)
        disk->metadata["drive"] = drv_types[dh.drv_type - 1];

    auto dos_date = util::le_value(dh.dos_date);
    auto dos_time = util::le_value(dh.dos_time);
    disk->metadata["created"] = FormatTime(dos_date, dos_time);

    data.resize(fmt.disk_size(), fmt.fill);
    disk->format(fmt, data);
    disk->strType = "CQM";

    return true;
}